

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildArgIn(IRBuilder *this,uint32 offset,RegSlot dstRegSlot,uint16 argument)

{
  Func *this_00;
  bool bVar1;
  uint16 uVar2;
  ArgSlot AVar3;
  ValueType valueType;
  undefined4 in_EAX;
  StackSym *stackSym;
  SymOpnd *src1Opnd;
  RegOpnd *this_01;
  JITTimeProfileInfo *this_02;
  Instr *instr;
  undefined6 in_register_0000000a;
  undefined4 uStack_38;
  uint32 local_34;
  ValueType profiledValueType;
  
  _uStack_38 = CONCAT44(offset,in_EAX);
  stackSym = StackSym::NewParamSlotSym(argument + 1,this->m_func);
  this_00 = this->m_func;
  uVar2 = LowererMD::GetFormalParamOffset();
  Func::SetArgOffset(this_00,stackSym,
                     ((uint)uVar2 + (int)CONCAT62(in_register_0000000a,argument)) * 8);
  src1Opnd = IR::SymOpnd::New(&stackSym->super_Sym,TyVar,this->m_func);
  this_01 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
  bVar1 = Func::IsLoopBody(this->m_func);
  if (!bVar1) {
    bVar1 = Func::HasProfileInfo(this->m_func);
    if (bVar1) {
      AVar3 = StackSym::GetParamSlotNum(stackSym);
      if (1 < AVar3) {
        ValueType::ValueType((ValueType *)((long)&uStack_38 + 2));
        this_02 = Func::GetReadOnlyProfileInfo(this->m_func);
        valueType = JITTimeProfileInfo::GetParameterInfo(this_02,AVar3 - 2);
        uStack_38 = CONCAT22(valueType.field_0,(undefined2)uStack_38);
        IR::Opnd::SetValueType(&this_01->super_Opnd,valueType);
      }
    }
  }
  instr = IR::Instr::New(ArgIn_A,&this_01->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  AddInstr(this,instr,local_34);
  return;
}

Assistant:

void
IRBuilder::BuildArgIn(uint32 offset, Js::RegSlot dstRegSlot, uint16 argument)
{
    IR::Instr *     instr;
    IR::SymOpnd *   srcOpnd;
    IR::RegOpnd *   dstOpnd;
    StackSym *      symSrc = StackSym::NewParamSlotSym(argument + 1, m_func);

    this->m_func->SetArgOffset(symSrc, (argument + LowererMD::GetFormalParamOffset()) * MachPtr);

    srcOpnd = IR::SymOpnd::New(symSrc, TyVar, m_func);
    dstOpnd = this->BuildDstOpnd(dstRegSlot);

    if (!this->m_func->IsLoopBody() && this->m_func->HasProfileInfo())
    {
        // Skip "this" pointer; "this" profile data is captured by ProfiledLdThis.
        // Subtract 1 to skip "this" pointer, subtract 1 again to get the index to index into profileData->parameterInfo.
        int paramSlotIndex = symSrc->GetParamSlotNum() - 2;
        if (paramSlotIndex >= 0)
        {
            ValueType profiledValueType;
            profiledValueType = this->m_func->GetReadOnlyProfileInfo()->GetParameterInfo(static_cast<Js::ArgSlot>(paramSlotIndex));
            dstOpnd->SetValueType(profiledValueType);
        }
    }

    instr = IR::Instr::New(Js::OpCode::ArgIn_A, dstOpnd, srcOpnd, m_func);
    this->AddInstr(instr, offset);
}